

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O2

ostream * glu::detail::operator<<(ostream *str,EnumPointerFmt *fmt)

{
  ostream *poVar1;
  deUint32 ndx;
  ulong uVar2;
  Enum<int,_4UL> local_38;
  
  if (fmt->value != (deUint32 *)0x0) {
    std::operator<<(str,"{ ");
    for (uVar2 = 0; uVar2 < fmt->size; uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::operator<<(str,", ");
      }
      local_38.m_getName = fmt->getName;
      local_38.m_value = fmt->value[uVar2];
      tcu::Format::Enum<int,_4UL>::toStream(&local_38,str);
    }
    std::operator<<(str," }");
    return str;
  }
  poVar1 = std::operator<<(str,"(null)");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const EnumPointerFmt& fmt)
{
	if (fmt.value)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			// use storage size (4) as print width for clarity
			str << tcu::Format::Enum<int, 4>(fmt.getName, fmt.value[ndx]);
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}